

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
::unchecked_emplace_with_rehash<slang::SVInt&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
          *this,size_t hash,SVInt *args)

{
  arrays_type new_arrays_;
  locator local_60;
  arrays_type local_48;
  
  table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
  ::new_arrays_for_growth
            (&local_48,
             (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
              *)this);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p = (SVInt *)0x0;
  nosize_unchecked_emplace_at<slang::SVInt&>
            (&local_60,this,&local_48,hash >> ((byte)local_48.groups_size_index & 0x3f),hash,args);
  __return_storage_ptr__->p = local_60.p;
  __return_storage_ptr__->pg = local_60.pg;
  __return_storage_ptr__->n = local_60.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_60._12_4_;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                      *)this,&local_48);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }